

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O0

size_t ZSTD_compressBlock_lazy_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  uint uVar1;
  uint uVar2;
  uint windowLog_00;
  BYTE *pBVar3;
  BYTE *pBVar4;
  int iVar5;
  int iVar6;
  U32 UVar7;
  U32 UVar8;
  uint uVar9;
  BYTE *iEnd;
  BYTE *pBVar10;
  BYTE *iStart;
  BYTE *pBVar11;
  size_t sVar12;
  BYTE *pBVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  BYTE *dst;
  bool bVar17;
  BYTE *local_3e8;
  BYTE *local_3d8;
  BYTE *local_3c8;
  BYTE *local_3c0;
  BYTE *local_370;
  BYTE *local_360;
  BYTE *local_358;
  BYTE *local_348;
  size_t srcSize_local;
  void *src_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  BYTE *repEnd_3;
  BYTE *repMatch_3;
  BYTE *repBase_3;
  U32 repIndex_3;
  U32 windowLow_3;
  U32 repCurrent;
  size_t litLength;
  BYTE *mStart;
  BYTE *match;
  U32 matchIndex;
  int gain1_3;
  int gain2_3;
  size_t ml2_2;
  size_t offset2_1;
  int gain1_2;
  int gain2_2;
  size_t repLength_1;
  BYTE *repEnd_2;
  BYTE *repMatch_2;
  BYTE *repBase_2;
  U32 repIndex_2;
  U32 windowLow_2;
  int gain1_1;
  int gain2_1;
  size_t ml2_1;
  size_t offset2;
  int gain1;
  int gain2;
  size_t repLength;
  BYTE *repEnd_1;
  BYTE *repMatch_1;
  BYTE *repBase_1;
  U32 repIndex_1;
  U32 windowLow_1;
  size_t ml2;
  size_t offsetFound;
  BYTE *repEnd;
  BYTE *repMatch;
  BYTE *repBase;
  U32 local_1e8;
  U32 repIndex;
  U32 windowLow;
  U32 curr;
  BYTE *start;
  size_t offset;
  size_t matchLength;
  U32 offset_2;
  U32 offset_1;
  searchMax_f searchMax;
  searchMax_f searchFuncs [3];
  U32 rowLog;
  U32 windowLog;
  BYTE *dictStart;
  BYTE *dictEnd;
  BYTE *dictBase;
  BYTE *prefixStart;
  U32 dictLimit;
  BYTE *base;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *anchor;
  BYTE *ip;
  BYTE *istart;
  BYTE *litEnd_1;
  BYTE *litLimit_w_1;
  BYTE *litEnd;
  BYTE *litLimit_w;
  BYTE *oend;
  BYTE *op;
  BYTE *ip_1;
  ptrdiff_t diff;
  BYTE *oend_1;
  BYTE *op_1;
  BYTE *ip_2;
  ptrdiff_t diff_1;
  
  iEnd = (BYTE *)((long)src + srcSize);
  pBVar10 = iEnd + -8;
  pBVar3 = (ms->window).base;
  uVar1 = (ms->window).dictLimit;
  iStart = pBVar3 + uVar1;
  pBVar4 = (ms->window).dictBase;
  pBVar11 = pBVar4 + uVar1;
  uVar2 = (ms->window).lowLimit;
  windowLog_00 = (ms->cParams).windowLog;
  searchMax = ZSTD_HcFindBestMatch_extDict_selectMLS;
  searchFuncs[0] = ZSTD_BtFindBestMatch_extDict_selectMLS;
  searchFuncs[1] = ZSTD_RowFindBestMatch_extDict_selectRowLog;
  _offset_2 = ZSTD_HcFindBestMatch_extDict_selectMLS;
  matchLength._4_4_ = *rep;
  matchLength._0_4_ = rep[1];
  anchor = (BYTE *)((long)src + (long)(int)(uint)((BYTE *)src == iStart));
  iend = (BYTE *)src;
  do {
    while( true ) {
      if (pBVar10 <= anchor) {
        *rep = matchLength._4_4_;
        rep[1] = (U32)matchLength;
        return (long)iEnd - (long)iend;
      }
      offset = 0;
      start = (BYTE *)0x0;
      _windowLow = anchor + 1;
      iVar5 = (int)pBVar3;
      repIndex = (int)anchor - iVar5;
      local_1e8 = ZSTD_getLowestMatchIndex(ms,repIndex + 1,windowLog_00);
      repBase._4_4_ = (repIndex + 1) - matchLength._4_4_;
      local_348 = pBVar3;
      if (repBase._4_4_ < uVar1) {
        local_348 = pBVar4;
      }
      repMatch = local_348;
      repEnd = local_348 + repBase._4_4_;
      if (2 < (uVar1 - 1) - repBase._4_4_ && matchLength._4_4_ < (repIndex + 1) - local_1e8) {
        UVar7 = MEM_read32(anchor + 1);
        UVar8 = MEM_read32(repEnd);
        if (UVar7 == UVar8) {
          local_358 = iEnd;
          if (repBase._4_4_ < uVar1) {
            local_358 = pBVar11;
          }
          offsetFound = (size_t)local_358;
          sVar12 = ZSTD_count_2segments(anchor + 5,repEnd + 4,iEnd,local_358,iStart);
          offset = sVar12 + 4;
        }
      }
      ml2 = 999999999;
      _repIndex_1 = (*_offset_2)(ms,anchor,iEnd,&ml2);
      if (offset < _repIndex_1) {
        _windowLow = anchor;
        start = (BYTE *)ml2;
        offset = _repIndex_1;
      }
      if (3 < offset) break;
      anchor = anchor + ((long)anchor - (long)iend >> 8) + 1;
    }
    while (anchor < pBVar10) {
      pBVar13 = anchor + 1;
      repIndex = repIndex + 1;
      if (start != (BYTE *)0x0) {
        repBase_1._4_4_ = ZSTD_getLowestMatchIndex(ms,repIndex,windowLog_00);
        repBase_1._0_4_ = repIndex - matchLength._4_4_;
        local_360 = pBVar3;
        if ((uint)repBase_1 < uVar1) {
          local_360 = pBVar4;
        }
        repMatch_1 = local_360;
        repEnd_1 = local_360 + (uint)repBase_1;
        if (2 < (uVar1 - 1) - (uint)repBase_1 && matchLength._4_4_ < repIndex - repBase_1._4_4_) {
          UVar7 = MEM_read32(pBVar13);
          UVar8 = MEM_read32(repEnd_1);
          if (UVar7 == UVar8) {
            local_370 = iEnd;
            if ((uint)repBase_1 < uVar1) {
              local_370 = pBVar11;
            }
            repLength = (size_t)local_370;
            sVar12 = ZSTD_count_2segments(anchor + 5,repEnd_1 + 4,iEnd,local_370,iStart);
            _gain1 = sVar12 + 4;
            offset2._4_4_ = (int)_gain1 * 3;
            iVar6 = (int)offset;
            UVar7 = ZSTD_highbit32((int)start + 1);
            offset2._0_4_ = (iVar6 * 3 - UVar7) + 1;
            if ((3 < _gain1) && ((int)offset2 < offset2._4_4_)) {
              offset = _gain1;
              start = (BYTE *)0x0;
              _windowLow = pBVar13;
            }
          }
        }
      }
      ml2_1 = 999999999;
      uVar15 = (*_offset_2)(ms,pBVar13,iEnd,&ml2_1);
      UVar7 = ZSTD_highbit32((int)ml2_1 + 1);
      lVar14 = offset << 2;
      UVar8 = ZSTD_highbit32((int)start + 1);
      if ((uVar15 < 4) || ((int)((int)(uVar15 << 2) - UVar7) <= (int)(((int)lVar14 - UVar8) + 4)))
      break;
      start = (BYTE *)ml2_1;
      _windowLow = pBVar13;
      offset = uVar15;
      anchor = pBVar13;
    }
    iVar6 = (int)start;
    if (start != (BYTE *)0x0) {
      uVar9 = ((int)_windowLow - iVar5) - (iVar6 + -2);
      if (uVar9 < uVar1) {
        local_3c0 = pBVar4 + uVar9;
      }
      else {
        local_3c0 = pBVar3 + uVar9;
      }
      mStart = local_3c0;
      local_3c8 = iStart;
      if (uVar9 < uVar1) {
        local_3c8 = pBVar4 + uVar2;
      }
      while( true ) {
        bVar17 = false;
        if ((iend < _windowLow) && (bVar17 = false, local_3c8 < mStart)) {
          bVar17 = _windowLow[-1] == mStart[-1];
        }
        if (!bVar17) break;
        _windowLow = _windowLow + -1;
        mStart = mStart + -1;
        offset = offset + 1;
      }
      matchLength._0_4_ = matchLength._4_4_;
      matchLength._4_4_ = iVar6 - 2;
    }
    uVar15 = (long)_windowLow - (long)iend;
    uVar16 = offset - 3;
    if (iEnd + -0x20 < iend + uVar15) {
      ZSTD_safecopyLiterals(seqStore->lit,iend,iend + uVar15,iEnd + -0x20);
    }
    else {
      ZSTD_copy16(seqStore->lit,iend);
      if (0x10 < uVar15) {
        pBVar13 = seqStore->lit;
        dst = pBVar13 + 0x10;
        ZSTD_copy16(dst,iend + 0x10);
        if (0x10 < (long)(uVar15 - 0x10)) {
          oend = pBVar13 + 0x20;
          do {
            op = iend + 0x20;
            ZSTD_copy16(oend,op);
            ZSTD_copy16(oend + 0x10,iend + 0x30);
            oend = oend + 0x20;
            iend = op;
          } while (oend < dst + (uVar15 - 0x10));
        }
      }
    }
    seqStore->lit = seqStore->lit + uVar15;
    if (0xffff < uVar15) {
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
    }
    seqStore->sequences->litLength = (U16)uVar15;
    seqStore->sequences->offset = iVar6 + 1;
    if (0xffff < uVar16) {
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos =
           (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
    }
    seqStore->sequences->matchLength = (U16)uVar16;
    seqStore->sequences = seqStore->sequences + 1;
    for (anchor = _windowLow + offset; iend = anchor, anchor <= pBVar10; anchor = anchor + offset) {
      UVar7 = (int)anchor - iVar5;
      UVar8 = ZSTD_getLowestMatchIndex(ms,UVar7,windowLog_00);
      uVar9 = UVar7 - (U32)matchLength;
      local_3d8 = pBVar3;
      if (uVar9 < uVar1) {
        local_3d8 = pBVar4;
      }
      if ((uVar1 - 1) - uVar9 < 3 || UVar7 - UVar8 <= (U32)matchLength) break;
      UVar7 = MEM_read32(anchor);
      UVar8 = MEM_read32(local_3d8 + uVar9);
      if (UVar7 != UVar8) break;
      local_3e8 = iEnd;
      if (uVar9 < uVar1) {
        local_3e8 = pBVar11;
      }
      sVar12 = ZSTD_count_2segments(anchor + 4,local_3d8 + uVar9 + 4,iEnd,local_3e8,iStart);
      uVar9 = (U32)matchLength;
      offset = sVar12 + 4;
      start = (BYTE *)(ulong)(U32)matchLength;
      matchLength._0_4_ = matchLength._4_4_;
      matchLength._4_4_ = uVar9;
      if (iEnd + -0x20 < anchor) {
        ZSTD_safecopyLiterals(seqStore->lit,anchor,anchor,iEnd + -0x20);
      }
      else {
        ZSTD_copy16(seqStore->lit,anchor);
      }
      seqStore->lit = seqStore->lit;
      seqStore->sequences->litLength = 0;
      seqStore->sequences->offset = 1;
      if (0xffff < sVar12 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
      }
      seqStore->sequences->matchLength = (U16)(sVar12 + 1);
      seqStore->sequences = seqStore->sequences + 1;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 1);
}